

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugFrame::parse(DWARFDebugFrame *this,DWARFDataExtractor Data)

{
  CIE *this_00;
  DWARFDataExtractor Data_00;
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  uint32_t uVar5;
  uint64_t LinkedCIEOffset;
  size_t sVar6;
  uint *puVar7;
  pointer pCVar8;
  CIE **ppCVar9;
  unsigned_long *puVar10;
  FDE *this_01;
  reference this_02;
  pointer this_03;
  CFIProgram *Offset_00;
  Error *E_00;
  StringRef SVar11;
  Optional<unsigned_long> OVar12;
  uint64_t local_408;
  uint64_t local_398;
  uint64_t local_380;
  uint64_t local_310;
  ulong local_2d0;
  uint8_t local_2a2;
  char *local_2a0;
  byte local_28a;
  byte local_289;
  byte local_279;
  Error local_250;
  string local_248;
  char *local_228;
  size_t sStack_220;
  undefined8 local_218;
  DWARFObject *pDStack_210;
  DWARFSection *local_208;
  undefined1 local_200 [8];
  Error E;
  FDE *local_1e0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  long local_1c8;
  uint64_t EndAugmentationOffset_1;
  uint64_t AugmentationLength_1;
  StringRef AugmentationString_1;
  Optional<unsigned_long> Val_1;
  Optional<unsigned_long> Val;
  CIE *Cie_1;
  Optional<unsigned_long> LSDAAddress;
  uint64_t AddressRange;
  uint64_t InitialLocation;
  uint64_t CIEPointer;
  __single_object Cie;
  uint64_t local_128;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint e;
  uint i;
  uint64_t EndAugmentationOffset;
  uint64_t StartAugmentationOffset;
  Optional<unsigned_long> AugmentationLength;
  Optional<unsigned_int> PersonalityEncoding;
  Optional<unsigned_long> Personality;
  uint32_t LSDAPointerEncoding;
  uint32_t FDEPointerEncoding;
  StringRef AugmentationData;
  uint64_t ReturnAddressRegister;
  int64_t DataAlignmentFactor;
  uint64_t CodeAlignmentFactor;
  undefined1 local_90 [6];
  uint8_t SegmentDescriptorSize;
  uint8_t AddressSize;
  StringRef AugmentationString;
  char *Augmentation;
  uint8_t Version;
  long lStack_70;
  bool IsCIE;
  uint64_t EndStructureOffset;
  uint64_t StartStructureOffset;
  uint64_t Id;
  uint64_t Length;
  uint64_t uStack_48;
  bool IsDWARF64;
  uint64_t StartOffset;
  undefined1 local_30 [8];
  DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
  CIEs;
  uint64_t Offset;
  DWARFDebugFrame *this_local;
  
  CIEs.NumBuckets = 0;
  CIEs._20_4_ = 0;
  DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
  ::DenseMap((DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
              *)local_30,0);
  do {
    bVar2 = DataExtractor::isValidOffset(&Data.super_DataExtractor,CIEs._16_8_);
    if (!bVar2) {
      DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
      ::~DenseMap((DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                   *)local_30);
      return;
    }
    uStack_48 = CIEs._16_8_;
    Length._7_1_ = 0;
    Id = DWARFDataExtractor::getRelocatedValue
                   (&Data,4,(uint64_t *)&CIEs.NumBuckets,(uint64_t *)0x0,(Error *)0x0);
    if (Id == 0xffffffff) {
      Length._7_1_ = 1;
      Id = DWARFDataExtractor::getRelocatedValue
                     (&Data,8,(uint64_t *)&CIEs.NumBuckets,(uint64_t *)0x0,(Error *)0x0);
    }
    EndStructureOffset = CIEs._16_8_;
    lStack_70 = CIEs._16_8_ + Id;
    local_279 = 0;
    if ((Length._7_1_ & 1) != 0) {
      local_279 = this->IsEH ^ 0xff;
    }
    LinkedCIEOffset =
         DataExtractor::getUnsigned
                   (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(local_279 & 1) * 4 + 4,
                    (Error *)0x0);
    if ((((Length._7_1_ & 1) == 0) || (local_289 = 1, LinkedCIEOffset != 0xffffffffffffffff)) &&
       (local_289 = 1, LinkedCIEOffset != 0xffffffff)) {
      local_28a = 0;
      if ((this->IsEH & 1U) != 0) {
        local_28a = LinkedCIEOffset != 0 ^ 0xff;
      }
      local_289 = local_28a;
    }
    Augmentation._7_1_ = local_289 & 1;
    StartStructureOffset = LinkedCIEOffset;
    if (Augmentation._7_1_ == 0) {
      AddressRange = 0;
      LSDAAddress.Storage.hasVal = false;
      LSDAAddress.Storage._9_7_ = 0;
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&Cie_1);
      local_380 = LinkedCIEOffset;
      if ((this->IsEH & 1U) != 0) {
        local_380 = EndStructureOffset - LinkedCIEOffset;
      }
      Val.Storage._8_8_ = local_380;
      ppCVar9 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                ::operator[]((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                              *)local_30,(unsigned_long *)&Val.Storage.hasVal);
      this_00 = *ppCVar9;
      if ((this->IsEH & 1U) == 0) {
        AddressRange = DWARFDataExtractor::getRelocatedAddress
                                 (&Data,(uint64_t *)&CIEs.NumBuckets,(uint64_t *)0x0);
        LSDAAddress.Storage._8_8_ =
             DWARFDataExtractor::getRelocatedAddress
                       (&Data,(uint64_t *)&CIEs.NumBuckets,(uint64_t *)0x0);
      }
      else {
        if (this_00 == (CIE *)0x0) {
          ReportError(uStack_48,"Parsing FDE data at %lx failed due to missing CIE");
        }
        uVar5 = dwarf::CIE::getFDEPointerEncoding(this_00);
        if (this->EHFrameAddress == 0) {
          local_398 = 0;
        }
        else {
          local_398 = this->EHFrameAddress + CIEs._16_8_;
        }
        OVar12 = DWARFDataExtractor::getEncodedPointer
                           (&Data,(uint64_t *)&CIEs.NumBuckets,(uint8_t)uVar5,local_398);
        Val_1.Storage._8_8_ = OVar12.Storage.field_0;
        Val.Storage.field_0.empty = OVar12.Storage.hasVal;
        bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&Val_1.Storage.hasVal);
        if (bVar2) {
          puVar10 = Optional<unsigned_long>::operator*
                              ((Optional<unsigned_long> *)&Val_1.Storage.hasVal);
          AddressRange = *puVar10;
        }
        uVar5 = dwarf::CIE::getFDEPointerEncoding(this_00);
        OVar12 = DWARFDataExtractor::getEncodedPointer
                           (&Data,(uint64_t *)&CIEs.NumBuckets,(uint8_t)uVar5,0);
        AugmentationString_1.Length = (size_t)OVar12.Storage.field_0;
        Val_1.Storage.field_0.empty = OVar12.Storage.hasVal;
        bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&AugmentationString_1.Length);
        if (bVar2) {
          puVar10 = Optional<unsigned_long>::operator*
                              ((Optional<unsigned_long> *)&AugmentationString_1.Length);
          LSDAAddress.Storage._8_8_ = *puVar10;
        }
        SVar11 = dwarf::CIE::getAugmentationString(this_00);
        AugmentationString_1.Data = (char *)SVar11.Length;
        AugmentationLength_1 = (uint64_t)SVar11.Data;
        bVar2 = StringRef::empty((StringRef *)&AugmentationLength_1);
        if (!bVar2) {
          EndAugmentationOffset_1 =
               DataExtractor::getULEB128
                         (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
          local_1c8 = CIEs._16_8_ + EndAugmentationOffset_1;
          uVar5 = dwarf::CIE::getLSDAPointerEncoding(this_00);
          if (uVar5 != 0xff) {
            uVar5 = dwarf::CIE::getLSDAPointerEncoding(this_00);
            if (this->EHFrameAddress == 0) {
              local_408 = 0;
            }
            else {
              local_408 = CIEs._16_8_ + this->EHFrameAddress;
            }
            OVar12 = DWARFDataExtractor::getEncodedPointer
                               (&Data,(uint64_t *)&CIEs.NumBuckets,(uint8_t)uVar5,local_408);
            local_1d8 = OVar12.Storage.field_0;
            local_1d0 = OVar12.Storage.hasVal;
            LSDAAddress.Storage.field_0.value._1_7_ = uStack_1cf;
            LSDAAddress.Storage.field_0.empty = local_1d0;
            Cie_1 = (CIE *)local_1d8.value;
          }
          if (CIEs._16_8_ != local_1c8) {
            ReportError(uStack_48,"Parsing augmentation data at %lx failed");
          }
        }
      }
      this_01 = (FDE *)operator_new(0x80);
      E.Payload = (ErrorInfoBase *)Cie_1;
      OVar12.Storage._8_8_ = LSDAAddress.Storage.field_0.value;
      OVar12.Storage.field_0 =
           (anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2)Cie_1;
      dwarf::FDE::FDE(this_01,uStack_48,Id,LinkedCIEOffset,AddressRange,LSDAAddress.Storage._8_8_,
                      this_00,OVar12,this->Arch);
      local_1e0 = this_01;
      std::
      vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
      ::emplace_back<llvm::dwarf::FDE*>
                ((vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
                  *)&this->Entries,&stack0xfffffffffffffe20);
    }
    else {
      Augmentation._6_1_ =
           DataExtractor::getU8(&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0)
      ;
      AugmentationString.Length =
           (size_t)DataExtractor::getCStr(&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets);
      local_2a0 = (char *)AugmentationString.Length;
      if ((char *)AugmentationString.Length == (char *)0x0) {
        local_2a0 = "";
      }
      StringRef::StringRef((StringRef *)local_90,local_2a0);
      if (Augmentation._6_1_ < 4) {
        local_2a2 = DataExtractor::getAddressSize(&Data.super_DataExtractor);
      }
      else {
        local_2a2 = DataExtractor::getU8
                              (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
      }
      CodeAlignmentFactor._7_1_ = local_2a2;
      DataExtractor::setAddressSize(&Data.super_DataExtractor,local_2a2);
      if (Augmentation._6_1_ < 4) {
        CodeAlignmentFactor._6_1_ = '\0';
      }
      else {
        CodeAlignmentFactor._6_1_ =
             DataExtractor::getU8
                       (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
      }
      DataAlignmentFactor =
           DataExtractor::getULEB128
                     (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
      ReturnAddressRegister =
           DataExtractor::getSLEB128(&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets);
      if (Augmentation._6_1_ == 1) {
        bVar3 = DataExtractor::getU8
                          (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
        local_2d0 = (ulong)bVar3;
      }
      else {
        local_2d0 = DataExtractor::getULEB128
                              (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
      }
      AugmentationData.Length = local_2d0;
      StringRef::StringRef((StringRef *)&LSDAPointerEncoding,"");
      Personality.Storage._12_4_ = 0;
      Personality.Storage.hasVal = true;
      Personality.Storage._9_3_ = 0;
      Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&PersonalityEncoding);
      Optional<unsigned_int>::Optional((Optional<unsigned_int> *)&AugmentationLength.Storage.hasVal)
      ;
      SVar11.Length = (size_t)AugmentationData.Data;
      SVar11.Data = _LSDAPointerEncoding;
      if ((this->IsEH & 1U) != 0) {
        Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&StartAugmentationOffset);
        local_104 = 0;
        sVar6 = StringRef::size((StringRef *)local_90);
        local_108 = (uint)sVar6;
        for (; local_104 != local_108; local_104 = local_104 + 1) {
          cVar4 = StringRef::operator[]((StringRef *)local_90,(ulong)local_104);
          switch(cVar4) {
          case 'B':
            break;
          default:
            ReportError(uStack_48,"Unknown augmentation character in entry at %lx");
          case 'L':
            bVar3 = DataExtractor::getU8
                              (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
            Personality.Storage._8_4_ = ZEXT14(bVar3);
            break;
          case 'P':
            bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&PersonalityEncoding);
            if (bVar2) {
              ReportError(uStack_48,"Duplicate personality in entry at %lx");
            }
            bVar3 = DataExtractor::getU8
                              (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
            local_10c = (uint)bVar3;
            Optional<unsigned_int>::operator=
                      ((Optional<unsigned_int> *)&AugmentationLength.Storage.hasVal,&local_10c);
            puVar7 = Optional<unsigned_int>::operator*
                               ((Optional<unsigned_int> *)&AugmentationLength.Storage.hasVal);
            if (this->EHFrameAddress == 0) {
              local_310 = 0;
            }
            else {
              local_310 = this->EHFrameAddress + CIEs._16_8_;
            }
            OVar12 = DWARFDataExtractor::getEncodedPointer
                               (&Data,(uint64_t *)&CIEs.NumBuckets,(uint8_t)*puVar7,local_310);
            local_120 = OVar12.Storage.field_0;
            local_118 = OVar12.Storage.hasVal;
            Personality.Storage.field_0.value._1_7_ = uStack_117;
            Personality.Storage.field_0.empty = local_118;
            PersonalityEncoding.Storage = (OptionalStorage<unsigned_int,_true>)local_120.value;
            break;
          case 'R':
            bVar3 = DataExtractor::getU8
                              (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,(Error *)0x0);
            Personality.Storage._12_4_ = ZEXT14(bVar3);
            break;
          case 'S':
            break;
          case 'z':
            if (local_104 != 0) {
              ReportError(uStack_48,"\'z\' must be the first character at %lx");
            }
            local_128 = DataExtractor::getULEB128
                                  (&Data.super_DataExtractor,(uint64_t *)&CIEs.NumBuckets,
                                   (Error *)0x0);
            Optional<unsigned_long>::operator=
                      ((Optional<unsigned_long> *)&StartAugmentationOffset,&local_128);
            uVar1 = CIEs._16_8_;
            EndAugmentationOffset = CIEs._16_8_;
            puVar10 = Optional<unsigned_long>::operator*
                                ((Optional<unsigned_long> *)&StartAugmentationOffset);
            _e = uVar1 + *puVar10;
          }
        }
        bVar2 = Optional<unsigned_long>::hasValue
                          ((Optional<unsigned_long> *)&StartAugmentationOffset);
        SVar11.Length = (size_t)AugmentationData.Data;
        SVar11.Data = _LSDAPointerEncoding;
        if (bVar2) {
          if (CIEs._16_8_ != _e) {
            ReportError(uStack_48,"Parsing augmentation data at %lx failed");
          }
          SVar11 = DataExtractor::getData(&Data.super_DataExtractor);
          Cie._M_t.super___uniq_ptr_impl<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>.
          _M_t.super__Tuple_impl<0UL,_llvm::dwarf::CIE_*,_std::default_delete<llvm::dwarf::CIE>_>.
          super__Head_base<0UL,_llvm::dwarf::CIE_*,_false>._M_head_impl =
               (__uniq_ptr_data<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>,_true,_true>
               )SVar11.Data;
          SVar11 = StringRef::slice((StringRef *)&Cie,EndAugmentationOffset,_e);
        }
      }
      AugmentationData.Data = (char *)SVar11.Length;
      _LSDAPointerEncoding = SVar11.Data;
      std::
      make_unique<llvm::dwarf::CIE,unsigned_long&,unsigned_long&,unsigned_char&,llvm::StringRef&,unsigned_char&,unsigned_char&,unsigned_long&,long&,unsigned_long&,llvm::StringRef&,unsigned_int&,unsigned_int&,llvm::Optional<unsigned_long>&,llvm::Optional<unsigned_int>&,llvm::Triple::ArchType_const&>
                (&CIEPointer,&stack0xffffffffffffffb8,(uchar *)&Id,
                 (StringRef *)((long)&Augmentation + 6),local_90,
                 (uchar *)((long)&CodeAlignmentFactor + 7),
                 (unsigned_long *)((long)&CodeAlignmentFactor + 6),&DataAlignmentFactor,
                 &ReturnAddressRegister,(StringRef *)&AugmentationData.Length,&LSDAPointerEncoding,
                 (uint *)&Personality.Storage.field_0xc,
                 (Optional<unsigned_long> *)&Personality.Storage.hasVal,&PersonalityEncoding,
                 (ArchType *)&AugmentationLength.Storage.hasVal);
      pCVar8 = std::unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>::get
                         ((unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_> *)
                          &CIEPointer);
      ppCVar9 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                ::operator[]((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                              *)local_30,&stack0xffffffffffffffb8);
      *ppCVar9 = pCVar8;
      std::
      vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
      ::emplace_back<std::unique_ptr<llvm::dwarf::CIE,std::default_delete<llvm::dwarf::CIE>>>
                ((vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
                  *)&this->Entries,
                 (unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_> *)&CIEPointer
                );
      std::unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_>::~unique_ptr
                ((unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_> *)&CIEPointer
                );
    }
    this_02 = std::
              vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
              ::back(&this->Entries);
    this_03 = std::
              unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>::
              operator->(this_02);
    Offset_00 = dwarf::FrameEntry::cfis(this_03);
    Data_00 = Data;
    local_208 = Data.Section;
    local_228 = Data.super_DataExtractor.Data.Data;
    sStack_220 = Data.super_DataExtractor.Data.Length;
    local_218._0_1_ = Data.super_DataExtractor.IsLittleEndian;
    local_218._1_1_ = Data.super_DataExtractor.AddressSize;
    local_218._2_6_ = Data.super_DataExtractor._18_6_;
    Data.Obj = Data_00.Obj;
    pDStack_210 = Data.Obj;
    Data = Data_00;
    dwarf::CFIProgram::parse
              ((CFIProgram *)local_200,Data_00,(uint64_t *)Offset_00,(uint64_t)&CIEs.NumBuckets);
    bVar2 = Error::operator_cast_to_bool((Error *)local_200);
    if (bVar2) {
      Error::Error(&local_250,(Error *)local_200);
      toString_abi_cxx11_(&local_248,(llvm *)&local_250,E_00);
      report_fatal_error(&local_248,true);
    }
    Error::~Error((Error *)local_200);
  } while (CIEs._16_8_ == lStack_70);
  ReportError(uStack_48,"Parsing entry instructions at %lx failed");
}

Assistant:

void DWARFDebugFrame::parse(DWARFDataExtractor Data) {
  uint64_t Offset = 0;
  DenseMap<uint64_t, CIE *> CIEs;

  while (Data.isValidOffset(Offset)) {
    uint64_t StartOffset = Offset;

    bool IsDWARF64 = false;
    uint64_t Length = Data.getRelocatedValue(4, &Offset);
    uint64_t Id;

    if (Length == dwarf::DW_LENGTH_DWARF64) {
      // DWARF-64 is distinguished by the first 32 bits of the initial length
      // field being 0xffffffff. Then, the next 64 bits are the actual entry
      // length.
      IsDWARF64 = true;
      Length = Data.getRelocatedValue(8, &Offset);
    }

    // At this point, Offset points to the next field after Length.
    // Length is the structure size excluding itself. Compute an offset one
    // past the end of the structure (needed to know how many instructions to
    // read).
    uint64_t StartStructureOffset = Offset;
    uint64_t EndStructureOffset = Offset + Length;

    // The Id field's size depends on the DWARF format
    Id = Data.getUnsigned(&Offset, (IsDWARF64 && !IsEH) ? 8 : 4);
    bool IsCIE =
        ((IsDWARF64 && Id == DW64_CIE_ID) || Id == DW_CIE_ID || (IsEH && !Id));

    if (IsCIE) {
      uint8_t Version = Data.getU8(&Offset);
      const char *Augmentation = Data.getCStr(&Offset);
      StringRef AugmentationString(Augmentation ? Augmentation : "");
      uint8_t AddressSize = Version < 4 ? Data.getAddressSize() :
                                          Data.getU8(&Offset);
      Data.setAddressSize(AddressSize);
      uint8_t SegmentDescriptorSize = Version < 4 ? 0 : Data.getU8(&Offset);
      uint64_t CodeAlignmentFactor = Data.getULEB128(&Offset);
      int64_t DataAlignmentFactor = Data.getSLEB128(&Offset);
      uint64_t ReturnAddressRegister =
          Version == 1 ? Data.getU8(&Offset) : Data.getULEB128(&Offset);

      // Parse the augmentation data for EH CIEs
      StringRef AugmentationData("");
      uint32_t FDEPointerEncoding = DW_EH_PE_absptr;
      uint32_t LSDAPointerEncoding = DW_EH_PE_omit;
      Optional<uint64_t> Personality;
      Optional<uint32_t> PersonalityEncoding;
      if (IsEH) {
        Optional<uint64_t> AugmentationLength;
        uint64_t StartAugmentationOffset;
        uint64_t EndAugmentationOffset;

        // Walk the augmentation string to get all the augmentation data.
        for (unsigned i = 0, e = AugmentationString.size(); i != e; ++i) {
          switch (AugmentationString[i]) {
            default:
              ReportError(
                  StartOffset,
                  "Unknown augmentation character in entry at %" PRIx64);
            case 'L':
              LSDAPointerEncoding = Data.getU8(&Offset);
              break;
            case 'P': {
              if (Personality)
                ReportError(StartOffset,
                            "Duplicate personality in entry at %" PRIx64);
              PersonalityEncoding = Data.getU8(&Offset);
              Personality = Data.getEncodedPointer(
                  &Offset, *PersonalityEncoding,
                  EHFrameAddress ? EHFrameAddress + Offset : 0);
              break;
            }
            case 'R':
              FDEPointerEncoding = Data.getU8(&Offset);
              break;
            case 'S':
              // Current frame is a signal trampoline.
              break;
            case 'z':
              if (i)
                ReportError(StartOffset,
                            "'z' must be the first character at %" PRIx64);
              // Parse the augmentation length first.  We only parse it if
              // the string contains a 'z'.
              AugmentationLength = Data.getULEB128(&Offset);
              StartAugmentationOffset = Offset;
              EndAugmentationOffset = Offset + *AugmentationLength;
              break;
            case 'B':
              // B-Key is used for signing functions associated with this
              // augmentation string
              break;
          }
        }

        if (AugmentationLength.hasValue()) {
          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");

          AugmentationData = Data.getData().slice(StartAugmentationOffset,
                                                  EndAugmentationOffset);
        }
      }

      auto Cie = std::make_unique<CIE>(
          StartOffset, Length, Version, AugmentationString, AddressSize,
          SegmentDescriptorSize, CodeAlignmentFactor, DataAlignmentFactor,
          ReturnAddressRegister, AugmentationData, FDEPointerEncoding,
          LSDAPointerEncoding, Personality, PersonalityEncoding, Arch);
      CIEs[StartOffset] = Cie.get();
      Entries.emplace_back(std::move(Cie));
    } else {
      // FDE
      uint64_t CIEPointer = Id;
      uint64_t InitialLocation = 0;
      uint64_t AddressRange = 0;
      Optional<uint64_t> LSDAAddress;
      CIE *Cie = CIEs[IsEH ? (StartStructureOffset - CIEPointer) : CIEPointer];

      if (IsEH) {
        // The address size is encoded in the CIE we reference.
        if (!Cie)
          ReportError(StartOffset, "Parsing FDE data at %" PRIx64
                                   " failed due to missing CIE");

        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(),
                EHFrameAddress ? EHFrameAddress + Offset : 0)) {
          InitialLocation = *Val;
        }
        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(), 0)) {
          AddressRange = *Val;
        }

        StringRef AugmentationString = Cie->getAugmentationString();
        if (!AugmentationString.empty()) {
          // Parse the augmentation length and data for this FDE.
          uint64_t AugmentationLength = Data.getULEB128(&Offset);

          uint64_t EndAugmentationOffset = Offset + AugmentationLength;

          // Decode the LSDA if the CIE augmentation string said we should.
          if (Cie->getLSDAPointerEncoding() != DW_EH_PE_omit) {
            LSDAAddress = Data.getEncodedPointer(
                &Offset, Cie->getLSDAPointerEncoding(),
                EHFrameAddress ? Offset + EHFrameAddress : 0);
          }

          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");
        }
      } else {
        InitialLocation = Data.getRelocatedAddress(&Offset);
        AddressRange = Data.getRelocatedAddress(&Offset);
      }

      Entries.emplace_back(new FDE(StartOffset, Length, CIEPointer,
                                   InitialLocation, AddressRange,
                                   Cie, LSDAAddress, Arch));
    }

    if (Error E =
            Entries.back()->cfis().parse(Data, &Offset, EndStructureOffset)) {
      report_fatal_error(toString(std::move(E)));
    }

    if (Offset != EndStructureOffset)
      ReportError(StartOffset,
                  "Parsing entry instructions at %" PRIx64 " failed");
  }
}